

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

MultiIndexSet *
TasGrid::makeSequenceSet
          (MultiIndexSet *__return_storage_ptr__,int cnum_dimensions,int depth,TypeDepth type,
          TypeOneDRule crule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  TypeDepth type_00;
  TypeOneDRule offset;
  bool bVar1;
  size_t sVar2;
  anon_class_1_0_00000001 local_89;
  function<int_(int)> local_88;
  byte local_51;
  anon_class_8_1_a7c29cff local_50;
  function<int_(int)> local_48;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *anisotropic_weights_local;
  TypeOneDRule crule_local;
  TypeDepth type_local;
  int depth_local;
  int cnum_dimensions_local;
  
  local_28 = anisotropic_weights;
  anisotropic_weights_local._0_4_ = crule;
  anisotropic_weights_local._4_4_ = type;
  crule_local = depth;
  type_local = cnum_dimensions;
  _depth_local = __return_storage_ptr__;
  bVar1 = OneDimensionalMeta::isExactQuadrature(type);
  offset = crule_local;
  type_00 = anisotropic_weights_local._4_4_;
  local_51 = 0;
  if (bVar1) {
    sVar2 = (size_t)(int)type_local;
    local_50.crule = (TypeOneDRule *)&anisotropic_weights_local;
    ::std::function<int(int)>::
    function<TasGrid::makeSequenceSet(int,int,TasGrid::TypeDepth,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)::_lambda(int)_1_,void>
              ((function<int(int)> *)&local_48,&local_50);
    local_51 = 1;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,sVar2,offset,type_00,&local_48,local_28,level_limits);
  }
  else {
    sVar2 = (size_t)(int)type_local;
    ::std::function<int(int)>::
    function<TasGrid::makeSequenceSet(int,int,TasGrid::TypeDepth,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)::_lambda(int)_2_,void>
              ((function<int(int)> *)&local_88,&local_89);
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,sVar2,offset,type_00,&local_88,local_28,level_limits);
    ::std::function<int_(int)>::~function((function<int_(int)> *)&local_88);
  }
  if ((local_51 & 1) != 0) {
    ::std::function<int_(int)>::~function((function<int_(int)> *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline MultiIndexSet makeSequenceSet(int cnum_dimensions, int depth, TypeDepth type, TypeOneDRule crule,
                                     const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    return (OneDimensionalMeta::isExactQuadrature(type)) ?
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return OneDimensionalMeta::getQExact(i, crule); },
                                               anisotropic_weights, level_limits) :
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return i; }, anisotropic_weights, level_limits);
}